

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O1

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,char *pathname)

{
  Fl_Menu_Item *pFVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ulong unaff_RBP;
  int t;
  ulong uVar6;
  long lVar7;
  char menupath [1024];
  char itempath [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  lVar7 = 0;
  memset(local_838,0,0x400);
  uVar6 = 0;
  do {
    if (this->menu_ == (Fl_Menu_Item *)0x0) {
      lVar4 = 0;
    }
    else {
      iVar3 = Fl_Menu_Item::size(this->menu_);
      lVar4 = (long)iVar3;
    }
    if (lVar4 <= (long)uVar6) {
      return -1;
    }
    pFVar1 = this->menu_;
    if ((*(byte *)((long)&pFVar1->flags + lVar7) & 0x40) == 0) {
      if (*(long *)((long)&pFVar1->text + lVar7) == 0) {
        pcVar5 = strrchr(local_838,0x2f);
        if (pcVar5 == (char *)0x0) {
          local_838[0] = '\0';
        }
        else {
          *pcVar5 = '\0';
        }
        bVar2 = false;
      }
      else {
        strcpy(local_438,local_838);
        if (local_438[0] != '\0') {
          fl_strlcat(local_438,"/",0x400);
        }
        fl_strlcat(local_438,*(char **)((long)&pFVar1->text + lVar7),0x400);
        iVar3 = strcmp(local_438,pathname);
        if (iVar3 == 0) {
          unaff_RBP = uVar6;
        }
        unaff_RBP = unaff_RBP & 0xffffffff;
        if (iVar3 != 0) goto LAB_001846de;
        bVar2 = true;
      }
    }
    else {
      if (local_838[0] != '\0') {
        fl_strlcat(local_838,"/",0x400);
      }
      fl_strlcat(local_838,*(char **)((long)&pFVar1->text + lVar7),0x400);
      iVar3 = strcmp(local_838,pathname);
      if (iVar3 == 0) {
        bVar2 = true;
        unaff_RBP = uVar6 & 0xffffffff;
      }
      else {
LAB_001846de:
        bVar2 = false;
      }
    }
    if (bVar2) {
      return (int)unaff_RBP;
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x38;
  } while( true );
}

Assistant:

int Fl_Menu_::find_index(const char *pathname) const {
  char menupath[1024] = "";	// File/Export
  for ( int t=0; t < size(); t++ ) {
    Fl_Menu_Item *m = menu_ + t;
    if (m->flags&FL_SUBMENU) {
      // IT'S A SUBMENU
      // we do not support searches through FL_SUBMENU_POINTER links
      if (menupath[0]) strlcat(menupath, "/", sizeof(menupath));
      strlcat(menupath, m->label(), sizeof(menupath));
      if (!strcmp(menupath, pathname)) return(t);
    } else {
      if (!m->label()) {
	// END OF SUBMENU? Pop back one level.
	char *ss = strrchr(menupath, '/');
	if ( ss ) *ss = 0;
	else menupath[0] = '\0';
	continue;
      }
      // IT'S A MENU ITEM
      char itempath[1024];	// eg. Edit/Copy
      strcpy(itempath, menupath);
      if (itempath[0]) strlcat(itempath, "/", sizeof(itempath));
      strlcat(itempath, m->label(), sizeof(itempath));
      if (!strcmp(itempath, pathname)) return(t);
    }
  }
  return(-1);
}